

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall rw::Image::compressPalette(Image *this)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  
  if (this->depth == 8) {
    if (0 < this->height) {
      pbVar1 = this->pixels;
      iVar2 = 0;
      do {
        pbVar4 = pbVar1;
        iVar3 = this->width;
        if (0 < this->width) {
          do {
            if (0xf < *pbVar4) {
              return;
            }
            iVar3 = iVar3 + -1;
            pbVar4 = pbVar4 + this->bpp;
          } while (iVar3 != 0);
        }
        pbVar1 = pbVar1 + this->stride;
        iVar2 = iVar2 + 1;
      } while (iVar2 != this->height);
    }
    this->depth = 4;
  }
  return;
}

Assistant:

void
Image::compressPalette(void)
{
	if(this->depth != 8)
		return;
	uint8 *pixels = this->pixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < this->width; x++){
			if(*line > 0xF) return;
			line += this->bpp;
		}
		pixels += this->stride;
	}
	this->depth = 4;
}